

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int convertCompoundSelectToSubquery(Walker *pWalker,Select *p)

{
  uint uVar1;
  Parse *pParse;
  sqlite3 *db;
  Expr **ppEVar2;
  ExprList_item *pEVar3;
  Select *pSVar4;
  SrcList *pSVar5;
  Expr *pExpr;
  ExprList *pEVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  Select *pSVar12;
  Select *pSVar13;
  byte bVar14;
  Token dummy;
  Token local_58;
  Token local_40;
  
  bVar14 = 0;
  iVar11 = 0;
  if (p->pPrior == (Select *)0x0) {
    return 0;
  }
  pEVar6 = p->pOrderBy;
  if (p == (Select *)0x0 || pEVar6 == (ExprList *)0x0) {
    return 0;
  }
  pSVar4 = p;
  while ((pSVar4->op == 0x83 || (pSVar4->op == 0x80))) {
    pSVar4 = pSVar4->pPrior;
    if (pSVar4 == (Select *)0x0) {
      return 0;
    }
  }
  uVar1 = pEVar6->nExpr;
  uVar8 = (ulong)uVar1;
  pEVar3 = pEVar6->a + (uVar8 - 1);
  do {
    uVar7 = (uint)uVar8;
    uVar10 = (int)uVar1 >> 0x1f & uVar1;
    if ((int)uVar7 < 1) break;
    ppEVar2 = &pEVar3->pExpr;
    uVar8 = (ulong)(uVar7 - 1);
    pEVar3 = pEVar3 + -1;
    uVar10 = uVar7;
  } while (((*ppEVar2)->flags & 0x100) == 0);
  if (0 < (int)uVar10) {
    pParse = pWalker->pParse;
    db = pParse->db;
    pSVar4 = (Select *)sqlite3DbMallocZero(db,0x80);
    iVar11 = 2;
    if (pSVar4 != (Select *)0x0) {
      local_58.z = (char *)0x0;
      local_58.n = 0;
      local_58._12_4_ = 0;
      pSVar5 = sqlite3SrcListAppendFromTerm
                         (pParse,(SrcList *)0x0,(Token *)0x0,(Token *)0x0,&local_58,pSVar4,
                          (Expr *)0x0,(IdList *)0x0);
      if (pSVar5 != (SrcList *)0x0) {
        pSVar12 = p;
        pSVar13 = pSVar4;
        for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
          pSVar13->pEList = pSVar12->pEList;
          pSVar12 = (Select *)((long)pSVar12 + (ulong)bVar14 * -0x10 + 8);
          pSVar13 = (Select *)((long)pSVar13 + (ulong)bVar14 * -0x10 + 8);
        }
        p->pSrc = pSVar5;
        local_40.z = (char *)0x0;
        local_40.n = 0;
        pExpr = sqlite3ExprAlloc(db,0xac,&local_40,0);
        pEVar6 = sqlite3ExprListAppend(pParse,(ExprList *)0x0,pExpr);
        p->pEList = pEVar6;
        p->op = 0x83;
        p->pWhere = (Expr *)0x0;
        pSVar4->pGroupBy = (ExprList *)0x0;
        pSVar4->pHaving = (Expr *)0x0;
        pSVar4->pOrderBy = (ExprList *)0x0;
        p->pWith = (With *)0x0;
        p->pPrior = (Select *)0x0;
        p->pNext = (Select *)0x0;
        p->selFlags = p->selFlags & 0xfffefeff | 0x10000;
        pSVar4->pPrior->pNext = pSVar4;
        pSVar4->pLimit = (Expr *)0x0;
        iVar11 = 0;
      }
    }
  }
  return iVar11;
}

Assistant:

static int convertCompoundSelectToSubquery(Walker *pWalker, Select *p){
  int i;
  Select *pNew;
  Select *pX;
  sqlite3 *db;
  struct ExprList_item *a;
  SrcList *pNewSrc;
  Parse *pParse;
  Token dummy;

  if( p->pPrior==0 ) return WRC_Continue;
  if( p->pOrderBy==0 ) return WRC_Continue;
  for(pX=p; pX && (pX->op==TK_ALL || pX->op==TK_SELECT); pX=pX->pPrior){}
  if( pX==0 ) return WRC_Continue;
  a = p->pOrderBy->a;
  for(i=p->pOrderBy->nExpr-1; i>=0; i--){
    if( a[i].pExpr->flags & EP_Collate ) break;
  }
  if( i<0 ) return WRC_Continue;

  /* If we reach this point, that means the transformation is required. */

  pParse = pWalker->pParse;
  db = pParse->db;
  pNew = sqlite3DbMallocZero(db, sizeof(*pNew) );
  if( pNew==0 ) return WRC_Abort;
  memset(&dummy, 0, sizeof(dummy));
  pNewSrc = sqlite3SrcListAppendFromTerm(pParse,0,0,0,&dummy,pNew,0,0);
  if( pNewSrc==0 ) return WRC_Abort;
  *pNew = *p;
  p->pSrc = pNewSrc;
  p->pEList = sqlite3ExprListAppend(pParse, 0, sqlite3Expr(db, TK_ASTERISK, 0));
  p->op = TK_SELECT;
  p->pWhere = 0;
  pNew->pGroupBy = 0;
  pNew->pHaving = 0;
  pNew->pOrderBy = 0;
  p->pPrior = 0;
  p->pNext = 0;
  p->pWith = 0;
  p->selFlags &= ~SF_Compound;
  assert( (p->selFlags & SF_Converted)==0 );
  p->selFlags |= SF_Converted;
  assert( pNew->pPrior!=0 );
  pNew->pPrior->pNext = pNew;
  pNew->pLimit = 0;
  return WRC_Continue;
}